

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

uint8_t absl::lts_20240722::strings_internal::CordTestAccess::LengthToTag(size_t s)

{
  byte bVar1;
  uint uVar2;
  string death_message;
  undefined1 local_b8 [32];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  AlphaNum local_78;
  long local_48;
  char *local_40;
  char local_38 [32];
  
  if (0xff3 < s) {
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Check s <= kMaxFlatLength failed: ","");
    local_78.piece_._M_len = 0xf;
    local_78.piece_._M_str = "Invalid length ";
    local_48 = absl::lts_20240722::numbers_internal::FastIntToBuffer(s,local_38);
    local_48 = local_48 - (long)local_38;
    local_40 = local_38;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b8,&local_78);
    std::__cxx11::string::_M_append((char *)local_98,local_b8._0_8_);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    (*raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.cc"
               ,0x622,local_98);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x622,
                  "static uint8_t absl::strings_internal::CordTestAccess::LengthToTag(size_t)");
  }
  uVar2 = (int)s + 0xd;
  bVar1 = (char)(uVar2 >> 6) + 0x3a;
  if (s < 500) {
    bVar1 = (char)(uVar2 >> 3) + 2;
  }
  if (bVar1 < 0xf9) {
    return bVar1;
  }
  __assert_fail("tag <= MAX_FLAT_TAG",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                ,0x5e,"uint8_t absl::cord_internal::AllocatedSizeToTag(size_t)");
}

Assistant:

uint8_t CordTestAccess::LengthToTag(size_t s) {
  ABSL_INTERNAL_CHECK(s <= kMaxFlatLength, absl::StrCat("Invalid length ", s));
  return cord_internal::AllocatedSizeToTag(s + cord_internal::kFlatOverhead);
}